

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

Error __thiscall
llvm::
handleErrorImpl<llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__0,llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__1>
          (llvm *this,
          unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload,
          anon_class_48_6_0fa2c5c1 *Handler,anon_class_40_5_28e94b40 *Handlers)

{
  anon_class_40_5_28e94b40 *H;
  bool bVar1;
  type E;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> local_48 [3];
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> local_30;
  anon_class_40_5_28e94b40 *local_28;
  anon_class_40_5_28e94b40 *Handlers_local;
  anon_class_48_6_0fa2c5c1 *Handler_local;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload_local;
  
  local_28 = Handlers;
  Handlers_local = (anon_class_40_5_28e94b40 *)Handler;
  Handler_local = (anon_class_48_6_0fa2c5c1 *)Payload;
  Payload_local = (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)this
  ;
  E = std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::operator*
                (Payload);
  bVar1 = ErrorHandlerTraits<void_(&)(llvm::DWARFDebugNames::SentinelError_&)>::appliesTo(E);
  H = Handlers_local;
  if (bVar1) {
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::unique_ptr
              (&local_30,Payload);
    ErrorHandlerTraits<void(&)(llvm::DWARFDebugNames::SentinelError&)>::
    apply<llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__0>
              ((ErrorHandlerTraits<void(&)(llvm::DWARFDebugNames::SentinelError&)> *)this,
               (anon_class_48_6_0fa2c5c1 *)H,&local_30);
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::~unique_ptr
              (&local_30);
  }
  else {
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::unique_ptr
              (local_48,Payload);
    handleErrorImpl<llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__1>
              (this,local_48,local_28);
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::~unique_ptr
              (local_48);
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error handleErrorImpl(std::unique_ptr<ErrorInfoBase> Payload,
                      HandlerT &&Handler, HandlerTs &&... Handlers) {
  if (ErrorHandlerTraits<HandlerT>::appliesTo(*Payload))
    return ErrorHandlerTraits<HandlerT>::apply(std::forward<HandlerT>(Handler),
                                               std::move(Payload));
  return handleErrorImpl(std::move(Payload),
                         std::forward<HandlerTs>(Handlers)...);
}